

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int addToSavepointBitvecs(Pager *pPager,Pgno pgno)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0x18;
  uVar2 = 0;
  for (lVar4 = 0; lVar4 < pPager->nSavepoint; lVar4 = lVar4 + 1) {
    if (pgno <= *(uint *)((long)pPager->aSavepoint->aWalData + lVar3 + -0x20)) {
      uVar1 = sqlite3BitvecSet(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar3 + -0x28),pgno
                              );
      uVar2 = uVar2 | uVar1;
    }
    lVar3 = lVar3 + 0x30;
  }
  return uVar2;
}

Assistant:

static int addToSavepointBitvecs(Pager *pPager, Pgno pgno){
  int ii;                   /* Loop counter */
  int rc = SQLITE_OK;       /* Result code */

  for(ii=0; ii<pPager->nSavepoint; ii++){
    PagerSavepoint *p = &pPager->aSavepoint[ii];
    if( pgno<=p->nOrig ){
      rc |= sqlite3BitvecSet(p->pInSavepoint, pgno);
      testcase( rc==SQLITE_NOMEM );
      assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    }
  }
  return rc;
}